

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::SetCacheEntryValue(cmState *this,string *key,string *value)

{
  pointer this_00;
  string *value_local;
  string *key_local;
  cmState *this_local;
  
  this_00 = std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::operator->
                      (&this->CacheManager);
  cmCacheManager::SetCacheEntryValue(this_00,key,value);
  return;
}

Assistant:

void cmState::SetCacheEntryValue(std::string const& key,
                                 std::string const& value)
{
  this->CacheManager->SetCacheEntryValue(key, value);
}